

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_ghost_dbl(REF_NODE ref_node,REF_DBL *vector,REF_INT ldim)

{
  size_t __size;
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  REF_INT *send_size;
  long lVar5;
  REF_INT *recv_size;
  long lVar6;
  void *pvVar7;
  undefined4 *puVar8;
  int iVar9;
  undefined8 uVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  REF_INT local;
  int local_9c;
  ulong local_98;
  void *local_90;
  ulong local_88;
  REF_NODE local_80;
  undefined1 local_78 [16];
  void *local_68;
  void *local_60;
  void *local_58;
  REF_DBL *local_50;
  ulong local_48;
  ulong local_40;
  undefined4 *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar4 = ref_mpi->n;
  if ((long)(int)uVar4 < 2) {
    return 0;
  }
  __size = (long)(int)uVar4 * 4;
  local_80 = ref_node;
  send_size = (REF_INT *)malloc(__size);
  auVar3 = _DAT_002170d0;
  if (send_size == (REF_INT *)0x0) {
    pcVar12 = "malloc a_size of REF_INT NULL";
    uVar10 = 0x464;
    goto LAB_0019931c;
  }
  lVar5 = (ulong)uVar4 - 1;
  auVar18._8_4_ = (int)lVar5;
  auVar18._0_8_ = lVar5;
  auVar18._12_4_ = (int)((ulong)lVar5 >> 0x20);
  lVar5 = 0;
  local_78 = auVar18 ^ _DAT_002170d0;
  auVar19 = _DAT_002170b0;
  auVar16 = _DAT_002170c0;
  do {
    auVar18 = auVar16 ^ auVar3;
    iVar9 = local_78._4_4_;
    if ((bool)(~(auVar18._4_4_ == iVar9 && local_78._0_4_ < auVar18._0_4_ || iVar9 < auVar18._4_4_)
              & 1)) {
      *(undefined4 *)((long)send_size + lVar5) = 0;
    }
    if ((auVar18._12_4_ != local_78._12_4_ || auVar18._8_4_ <= local_78._8_4_) &&
        auVar18._12_4_ <= local_78._12_4_) {
      *(undefined4 *)((long)send_size + lVar5 + 4) = 0;
    }
    auVar18 = auVar19 ^ auVar3;
    iVar20 = auVar18._4_4_;
    if (iVar20 <= iVar9 && (iVar20 != iVar9 || auVar18._0_4_ <= local_78._0_4_)) {
      *(undefined4 *)((long)send_size + lVar5 + 8) = 0;
      *(undefined4 *)((long)send_size + lVar5 + 0xc) = 0;
    }
    lVar6 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 4;
    auVar16._8_8_ = lVar6 + 4;
    lVar6 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 4;
    auVar19._8_8_ = lVar6 + 4;
    lVar5 = lVar5 + 0x10;
  } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar5);
  local_50 = vector;
  recv_size = (REF_INT *)malloc(__size);
  auVar3 = _DAT_002170d0;
  if (recv_size == (REF_INT *)0x0) {
    pcVar12 = "malloc b_size of REF_INT NULL";
    uVar10 = 0x465;
    goto LAB_0019931c;
  }
  lVar5 = 0;
  auVar15 = _DAT_002170b0;
  auVar17 = _DAT_002170c0;
  do {
    auVar19 = auVar17 ^ auVar3;
    if ((bool)(~(auVar19._4_4_ == local_78._4_4_ && (int)local_78._0_4_ < auVar19._0_4_ ||
                (int)local_78._4_4_ < auVar19._4_4_) & 1)) {
      *(undefined4 *)((long)recv_size + lVar5) = 0;
    }
    if ((auVar19._12_4_ != local_78._12_4_ || auVar19._8_4_ <= (int)local_78._8_4_) &&
        auVar19._12_4_ <= (int)local_78._12_4_) {
      *(undefined4 *)((long)recv_size + lVar5 + 4) = 0;
    }
    auVar19 = auVar15 ^ auVar3;
    iVar9 = auVar19._4_4_;
    if (iVar9 <= (int)local_78._4_4_ &&
        (iVar9 != local_78._4_4_ || auVar19._0_4_ <= (int)local_78._0_4_)) {
      *(undefined4 *)((long)recv_size + lVar5 + 8) = 0;
      *(undefined4 *)((long)recv_size + lVar5 + 0xc) = 0;
    }
    lVar6 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 4;
    auVar17._8_8_ = lVar6 + 4;
    lVar6 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 4;
    auVar15._8_8_ = lVar6 + 4;
    lVar5 = lVar5 + 0x10;
  } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar5);
  iVar9 = local_80->max;
  if (0 < (long)iVar9) {
    pRVar2 = local_80->global;
    lVar5 = 0;
    do {
      if ((-1 < pRVar2[lVar5]) && (ref_mpi->id != local_80->part[lVar5])) {
        send_size[local_80->part[lVar5]] = send_size[local_80->part[lVar5]] + 1;
      }
      lVar5 = lVar5 + 1;
    } while (iVar9 != lVar5);
  }
  uVar4 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
  if (uVar4 != 0) {
    pcVar12 = "alltoall sizes";
    uVar10 = 0x46e;
    goto LAB_001992cc;
  }
  local_78._0_4_ = ldim;
  uVar4 = ref_mpi->n;
  lVar5 = (long)(int)uVar4;
  if (lVar5 < 1) {
    uVar13 = 0;
    pvVar7 = malloc(0);
    local_98 = 0;
    uVar11 = 0;
    if (pvVar7 != (void *)0x0) {
LAB_0019942b:
      local_88 = (ulong)uVar13;
      local_90 = (void *)(local_88 * 8);
      local_60 = pvVar7;
      pvVar7 = malloc((size_t)local_90);
      if (pvVar7 == (void *)0x0) {
        pcVar12 = "malloc b_global of REF_GLOB NULL";
        uVar10 = 0x476;
      }
      else {
        if ((int)uVar4 < 0) {
          pcVar12 = "malloc a_next of REF_INT negative";
          uVar10 = 0x478;
          goto LAB_0019957e;
        }
        local_58 = pvVar7;
        puVar8 = (undefined4 *)malloc(lVar5 * 4);
        if (puVar8 == (undefined4 *)0x0) {
          pcVar12 = "malloc a_next of REF_INT NULL";
          uVar10 = 0x478;
        }
        else {
          *puVar8 = 0;
          if (1 < uVar4) {
            lVar6 = 0;
            iVar9 = 0;
            do {
              iVar9 = iVar9 + send_size[lVar6];
              puVar8[lVar6 + 1] = iVar9;
              lVar6 = lVar6 + 1;
            } while (lVar5 + -1 != lVar6);
          }
          iVar9 = local_80->max;
          if (0 < (long)iVar9) {
            pRVar2 = local_80->global;
            lVar5 = 0;
            do {
              if ((-1 < pRVar2[lVar5]) && (iVar20 = local_80->part[lVar5], ref_mpi->id != iVar20)) {
                iVar1 = puVar8[iVar20];
                *(REF_GLOB *)((long)local_60 + (long)iVar1 * 8) = pRVar2[lVar5];
                puVar8[iVar20] = iVar1 + 1;
              }
              lVar5 = lVar5 + 1;
            } while (iVar9 != lVar5);
          }
          local_38 = puVar8;
          uVar4 = ref_mpi_alltoallv(ref_mpi,local_60,send_size,local_58,recv_size,1,2);
          if (uVar4 != 0) {
            pcVar12 = "alltoallv global";
            uVar10 = 0x487;
LAB_001992cc:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   uVar10,"ref_node_ghost_dbl",(ulong)uVar4,pcVar12);
            return uVar4;
          }
          iVar9 = (int)(0x7fffffff / (long)(int)local_78._0_4_);
          if (((int)uVar11 < iVar9) && ((int)uVar13 < iVar9)) {
            if ((int)(uVar11 * local_78._0_4_) < 0) {
              pcVar12 = "malloc a_vector of REF_DBL negative";
              uVar10 = 0x48a;
LAB_0019957e:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,uVar10,"ref_node_ghost_dbl",pcVar12);
              return 1;
            }
            local_68 = malloc((ulong)(uVar11 * local_78._0_4_) << 3);
            if (local_68 == (void *)0x0) {
              pcVar12 = "malloc a_vector of REF_DBL NULL";
              uVar10 = 0x48a;
            }
            else {
              if ((int)(uVar13 * local_78._0_4_) < 0) {
                pcVar12 = "malloc b_vector of REF_DBL negative";
                uVar10 = 0x48b;
                goto LAB_0019957e;
              }
              local_90 = malloc((ulong)(uVar13 * local_78._0_4_) << 3);
              if (local_90 != (void *)0x0) {
                if (uVar13 != 0) {
                  local_40 = (ulong)(uint)local_78._0_4_ << 3;
                  local_98 = 0;
                  local_48 = (ulong)(int)local_78._0_4_;
                  uVar14 = 0;
                  do {
                    uVar4 = ref_node_local(local_80,*(REF_GLOB *)((long)local_58 + uVar14 * 8),
                                           &local_9c);
                    if (uVar4 != 0) {
                      pcVar12 = "g2l";
                      uVar10 = 0x48d;
                      goto LAB_001992cc;
                    }
                    iVar9 = (int)local_98;
                    if (0 < (int)local_78._0_4_) {
                      memcpy((void *)((long)local_90 + (local_98 & 0xffffffff) * 8),
                             local_50 + (long)local_9c * local_48,local_40);
                    }
                    uVar14 = uVar14 + 1;
                    local_98 = (ulong)(uint)(iVar9 + local_78._0_4_);
                  } while (local_88 != uVar14);
                }
                uVar4 = ref_mpi_alltoallv(ref_mpi,local_90,recv_size,local_68,send_size,
                                          local_78._0_4_,3);
                if (uVar4 == 0) {
                  if (uVar11 != 0) {
                    local_98 = (ulong)(uint)local_78._0_4_ << 3;
                    uVar13 = 0;
                    local_88 = (ulong)(int)local_78._0_4_;
                    uVar14 = 0;
                    do {
                      uVar4 = ref_node_local(local_80,*(REF_GLOB *)((long)local_60 + uVar14 * 8),
                                             &local_9c);
                      if (uVar4 != 0) {
                        pcVar12 = "g2l";
                        uVar10 = 0x497;
                        goto LAB_001992cc;
                      }
                      if (0 < (int)local_78._0_4_) {
                        memcpy(local_50 + (long)local_9c * local_88,
                               (void *)((long)local_68 + (ulong)uVar13 * 8),local_98);
                      }
                      uVar14 = uVar14 + 1;
                      uVar13 = uVar13 + local_78._0_4_;
                    } while (uVar11 != uVar14);
                  }
                  goto LAB_00199a62;
                }
                pcVar12 = "alltoallv vector";
                uVar10 = 0x494;
                goto LAB_001992cc;
              }
              pcVar12 = "malloc b_vector of REF_DBL NULL";
              uVar10 = 0x48b;
              local_90 = (void *)0x0;
            }
          }
          else {
            local_68 = malloc(local_98);
            if (local_68 == (void *)0x0) {
              pcVar12 = "malloc a_vector of REF_DBL NULL";
              uVar10 = 0x49e;
            }
            else {
              local_90 = malloc((size_t)local_90);
              if (local_90 != (void *)0x0) {
                if (0 < (int)local_78._0_4_) {
                  local_40 = 1;
                  if (1 < (int)uVar13) {
                    local_40 = (ulong)uVar13;
                  }
                  local_48 = 1;
                  if (1 < (int)uVar11) {
                    local_48 = (ulong)uVar11;
                  }
                  local_88 = 0;
                  do {
                    if (uVar13 != 0) {
                      uVar14 = 0;
                      do {
                        local_98 = uVar14;
                        uVar4 = ref_node_local(local_80,*(REF_GLOB *)((long)local_58 + uVar14 * 8),
                                               &local_9c);
                        if (uVar4 != 0) {
                          pcVar12 = "g2l";
                          uVar10 = 0x4a2;
                          goto LAB_001992cc;
                        }
                        *(REF_DBL *)((long)local_90 + local_98 * 8) =
                             local_50[local_9c * local_78._0_4_ + (int)local_88];
                        uVar14 = local_98 + 1;
                      } while (local_40 != uVar14);
                    }
                    uVar4 = ref_mpi_alltoallv(ref_mpi,local_90,recv_size,local_68,send_size,1,3);
                    if (uVar4 != 0) {
                      pcVar12 = "alltoallv vector";
                      uVar10 = 0x4a8;
                      goto LAB_001992cc;
                    }
                    if (uVar11 != 0) {
                      uVar14 = 0;
                      do {
                        local_98 = uVar14;
                        uVar4 = ref_node_local(local_80,*(REF_GLOB *)((long)local_60 + uVar14 * 8),
                                               &local_9c);
                        if (uVar4 != 0) {
                          pcVar12 = "g2l";
                          uVar10 = 0x4ab;
                          goto LAB_001992cc;
                        }
                        local_50[local_9c * local_78._0_4_ + (int)local_88] =
                             *(REF_DBL *)((long)local_68 + local_98 * 8);
                        uVar14 = local_98 + 1;
                      } while (local_48 != uVar14);
                    }
                    uVar4 = (int)local_88 + 1;
                    local_88 = (ulong)uVar4;
                  } while (uVar4 != local_78._0_4_);
                }
LAB_00199a62:
                free(local_90);
                free(local_68);
                free(local_38);
                free(local_58);
                free(local_60);
                free(recv_size);
                free(send_size);
                return 0;
              }
              pcVar12 = "malloc b_vector of REF_DBL NULL";
              uVar10 = 0x49f;
              local_90 = (void *)0x0;
            }
          }
        }
      }
      goto LAB_0019931c;
    }
  }
  else {
    lVar6 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + send_size[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
    if ((int)uVar11 < 0) {
      pcVar12 = "malloc a_global of REF_GLOB negative";
      uVar10 = 0x472;
      goto LAB_0019957e;
    }
    local_98 = (ulong)uVar11 << 3;
    pvVar7 = malloc(local_98);
    if (pvVar7 != (void *)0x0) {
      if ((int)uVar4 < 1) {
        uVar13 = 0;
      }
      else {
        lVar6 = 0;
        uVar13 = 0;
        do {
          uVar13 = uVar13 + recv_size[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
        if ((int)uVar13 < 0) {
          pcVar12 = "malloc b_global of REF_GLOB negative";
          uVar10 = 0x476;
          goto LAB_0019957e;
        }
      }
      goto LAB_0019942b;
    }
  }
  pcVar12 = "malloc a_global of REF_GLOB NULL";
  uVar10 = 0x472;
LAB_0019931c:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar10,
         "ref_node_ghost_dbl",pcVar12);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_ghost_dbl(REF_NODE ref_node, REF_DBL *vector,
                                      REF_INT ldim) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_DBL *a_vector, *b_vector;
  REF_INT i, local;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_global, a_total, REF_GLOB);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_global, b_total, REF_GLOB);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  if (a_total < REF_INT_MAX / ldim && b_total < REF_INT_MAX / ldim) {
    ref_malloc(a_vector, ldim * a_total, REF_DBL);
    ref_malloc(b_vector, ldim * b_total, REF_DBL);
    for (node = 0; node < b_total; node++) {
      RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        b_vector[i + ldim * node] = vector[i + ldim * local];
    }

    RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, ldim,
                          REF_DBL_TYPE),
        "alltoallv vector");

    for (node = 0; node < a_total; node++) {
      RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        vector[i + ldim * local] = a_vector[i + ldim * node];
    }
    free(b_vector);
    free(a_vector);
  } else {
    ref_malloc(a_vector, a_total, REF_DBL);
    ref_malloc(b_vector, b_total, REF_DBL);
    for (i = 0; i < ldim; i++) {
      for (node = 0; node < b_total; node++) {
        RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
        b_vector[node] = vector[i + ldim * local];
      }

      RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, 1,
                            REF_DBL_TYPE),
          "alltoallv vector");

      for (node = 0; node < a_total; node++) {
        RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
        vector[i + ldim * local] = a_vector[node];
      }
    }
    free(b_vector);
    free(a_vector);
  }
  free(a_next);
  free(b_global);
  free(a_global);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}